

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

string * cs_impl::string_cs_ext::cut(string *__return_storage_ptr__,string *str,numeric *n)

{
  pointer pcVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  lVar2 = (long)ROUND(*(longdouble *)&n->data);
  if (n->type != false) {
    lVar2 = (n->data)._int;
  }
  if (lVar2 != 0) {
    uVar4 = 0;
    do {
      std::__cxx11::string::pop_back();
      uVar3 = (ulong)ROUND(*(longdouble *)&n->data);
      if (n->type != false) {
        uVar3 = (n->data)._int;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar3);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string cut(string &str, const numeric& n)
		{
			for (std::size_t i = 0; i < n.as_integer(); ++i)
				str.pop_back();
			return str;
		}